

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

ArrayNew * __thiscall
wasm::Builder::makeArrayNew(Builder *this,HeapType type,Expression *size,Expression *init)

{
  ArrayNew *pAVar1;
  
  pAVar1 = (ArrayNew *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression._id = ArrayNewId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id = 0;
  pAVar1->init = (Expression *)0x0;
  pAVar1->size = size;
  pAVar1->init = init;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (pAVar1->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id = type.id;
    ::wasm::ArrayNew::finalize();
    return pAVar1;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

ArrayNew*
  makeArrayNew(HeapType type, Expression* size, Expression* init = nullptr) {
    auto* ret = wasm.allocator.alloc<ArrayNew>();
    ret->size = size;
    ret->init = init;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }